

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

bool bssl::dtls1_finish_message(SSL *ssl,CBB *cbb,Array<unsigned_char> *out_msg)

{
  uchar *puVar1;
  bool bVar2;
  
  bVar2 = CBBFinishArray(cbb,out_msg);
  if ((bVar2) && (0xb < out_msg->size_)) {
    puVar1 = out_msg->data_;
    puVar1[3] = puVar1[0xb];
    *(undefined2 *)(puVar1 + 1) = *(undefined2 *)(puVar1 + 9);
    bVar2 = true;
  }
  else {
    bVar2 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x234);
  }
  return bVar2;
}

Assistant:

bool dtls1_finish_message(const SSL *ssl, CBB *cbb, Array<uint8_t> *out_msg) {
  if (!CBBFinishArray(cbb, out_msg) ||
      out_msg->size() < DTLS1_HM_HEADER_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Fix up the header. Copy the fragment length into the total message
  // length.
  OPENSSL_memcpy(out_msg->data() + 1,
                 out_msg->data() + DTLS1_HM_HEADER_LENGTH - 3, 3);
  return true;
}